

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::csharp::ToCSharpName
                   (string *__return_storage_ptr__,string *name,FileDescriptor *file)

{
  size_type *psVar1;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  string result;
  string classname;
  undefined1 local_38 [16];
  
  GetFileNamespace_abi_cxx11_((string *)local_88,(csharp *)file,file);
  if (result._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::push_back((char)local_88);
  }
  psVar1 = &classname._M_string_length;
  classname._M_dataplus._M_p = (pointer)0x0;
  classname._M_string_length._0_1_ = 0;
  result.field_2._8_8_ = psVar1;
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::_M_assign((string *)(result.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&classname.field_2 + 8),(ulong)name);
    std::__cxx11::string::operator=
              ((string *)(result.field_2._M_local_buf + 8),
               (string *)(classname.field_2._M_local_buf + 8));
    if ((undefined1 *)classname.field_2._8_8_ != local_38) {
      operator_delete((void *)classname.field_2._8_8_);
    }
  }
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,".","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,".Types.","");
  google::protobuf::StringReplace
            ((string *)(classname.field_2._M_local_buf + 8),
             (string *)(result.field_2._M_local_buf + 8),(string *)local_c8,SUB81(local_a8,0));
  std::__cxx11::string::_M_append(local_88,classname.field_2._8_8_);
  if ((undefined1 *)classname.field_2._8_8_ != local_38) {
    operator_delete((void *)classname.field_2._8_8_);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  std::operator+(__return_storage_ptr__,"global::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((size_type *)result.field_2._8_8_ != psVar1) {
    operator_delete((void *)result.field_2._8_8_);
  }
  if (local_88 != (undefined1  [8])&result._M_string_length) {
    operator_delete((void *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (!result.empty()) {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}